

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_ext_pre_shared_key_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  bool bVar2;
  CBB contents;
  CBB local_40;
  
  bVar2 = true;
  if ((hs->ssl->s3->field_0xdc & 0x20) != 0) {
    iVar1 = CBB_add_u16(out,0x29);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&local_40), iVar1 != 0)) {
      iVar1 = CBB_add_u16(&local_40,0);
      if (iVar1 == 0) {
        return false;
      }
      iVar1 = CBB_flush(out);
      return iVar1 != 0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ssl_ext_pre_shared_key_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->ssl->s3->session_reused) {
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out, TLSEXT_TYPE_pre_shared_key) ||  //
      !CBB_add_u16_length_prefixed(out, &contents) ||   //
      // We only consider the first identity for resumption
      !CBB_add_u16(&contents, 0) ||  //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}